

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.cpp
# Opt level: O2

void __thiscall
Memory::
PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
::OnAllocFromNewSegment
          (PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
           *this,uint pageCount,void *pages,
          SegmentBase<Memory::PreReservedVirtualAllocWrapper> *newSegment)

{
  uint uVar1;
  ulong uVar2;
  DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount> *list;
  
  uVar1 = this->maxAllocPageCount;
  LogAllocPages(this,(ulong)pageCount);
  FillAllocPages(this,pages,pageCount);
  uVar2 = this->freePageCount - (ulong)pageCount;
  this->freePageCount = uVar2;
  if (uVar2 < this->debugMinFreePageCount) {
    this->debugMinFreePageCount = uVar2;
  }
  list = &this->segments;
  if (uVar1 == pageCount) {
    list = &this->fullSegments;
  }
  DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount>::MoveHeadTo
            (&this->emptySegments,list);
  return;
}

Assistant:

void
PageAllocatorBase<TVirtualAlloc, TSegment, TPageSegment>::OnAllocFromNewSegment(uint pageCount, __in void* pages, TSegment* newSegment)
{
    DListBase<TPageSegment>* targetSegmentList = (pageCount == maxAllocPageCount) ? &fullSegments : &segments;
    LogAllocPages(pageCount);

    this->FillAllocPages(pages, pageCount);
    this->freePageCount -= pageCount;
#if DBG
    UpdateMinimum(this->debugMinFreePageCount, this->freePageCount);
#endif

    Assert(targetSegmentList != nullptr);
    emptySegments.MoveHeadTo(targetSegmentList);
}